

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZVec<int>_>::Resize(TPZVec<TPZVec<int>_> *this,int64_t newsize,TPZVec<int> *object)

{
  TPZVec<int> *pTVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  ulong *puVar4;
  ulong in_RSI;
  long in_RDI;
  ulong uVar5;
  int64_t i;
  int64_t large;
  TPZVec<int> *newstore;
  TPZVec<int> *this_01;
  TPZVec<int> *in_stack_ffffffffffffff48;
  int64_t *piVar6;
  TPZVec<int> *in_stack_ffffffffffffff50;
  long lVar7;
  ulong local_98;
  TPZVec<int> *local_70;
  long local_40;
  TPZVec<int> *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (TPZVec<int> *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar3 = SUB168(auVar2 * ZEXT816(0x20),0);
      uVar5 = uVar3 + 8;
      if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar4 = (ulong *)operator_new__(uVar5);
      *puVar4 = in_RSI;
      local_20 = (TPZVec<int> *)(puVar4 + 1);
      if (in_RSI != 0) {
        local_70 = local_20;
        do {
          TPZVec<int>::TPZVec(local_70);
          local_70 = local_70 + 1;
        } while (local_70 != local_20 + in_RSI);
      }
    }
    local_98 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_98 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_40 = 0; local_40 < (long)local_98; local_40 = local_40 + 1) {
      TPZVec<int>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    for (; local_40 < (long)in_RSI; local_40 = local_40 + 1) {
      TPZVec<int>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      pTVar1 = *(TPZVec<int> **)(in_RDI + 8);
      if (pTVar1 != (TPZVec<int> *)0x0) {
        piVar6 = &pTVar1[-1].fNAlloc;
        lVar7 = pTVar1[-1].fNAlloc;
        this_01 = pTVar1 + lVar7;
        while (pTVar1 != this_01) {
          this_01 = this_01 + -1;
          TPZVec<int>::~TPZVec(this_01);
        }
        operator_delete__(piVar6,lVar7 * 0x20 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(TPZVec<int> **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}